

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_helpers.hpp
# Opt level: O0

string_t duckdb::HistogramStringFunctorBase::ExtractValue<duckdb::string_t>
                   (UnifiedVectorFormat *bin_data,idx_t offset,AggregateInputData *aggr_input)

{
  anon_union_16_2_67f50693_for_value aVar1;
  bool bVar2;
  uint uVar3;
  string_t *psVar4;
  idx_t iVar5;
  string_t *this;
  char *__src;
  idx_t in_RSI;
  UnifiedVectorFormat *in_RDI;
  data_ptr_t string_memory;
  uint input_str_size;
  string_t *input_str;
  string_t histogram_str;
  undefined4 in_stack_ffffffffffffffc8;
  ArenaAllocator *this_00;
  undefined8 local_10;
  undefined8 local_8;
  
  psVar4 = UnifiedVectorFormat::GetData<duckdb::string_t>(in_RDI);
  iVar5 = SelectionVector::get_index(*(SelectionVector **)in_RDI,in_RSI);
  this_00 = (ArenaAllocator *)(psVar4 + iVar5);
  bVar2 = string_t::IsInlined((string_t *)0xb8e1a2);
  if (bVar2) {
    local_10 = *(undefined8 *)this_00;
    local_8 = *(undefined8 *)(this_00 + 8);
  }
  else {
    iVar5 = string_t::GetSize((string_t *)this_00);
    uVar3 = UnsafeNumericCast<unsigned_int,unsigned_long,void>(iVar5);
    this = (string_t *)ArenaAllocator::Allocate(this_00,CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    psVar4 = this;
    __src = string_t::GetData(this);
    memcpy(this,__src,(ulong)uVar3);
    char_ptr_cast<unsigned_char>((uchar *)psVar4);
    string_t::string_t((string_t *)this_00,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),
                       (uint32_t)((ulong)psVar4 >> 0x20));
  }
  aVar1.pointer.ptr = (char *)local_8;
  aVar1._0_8_ = local_10;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static T ExtractValue(UnifiedVectorFormat &bin_data, idx_t offset, AggregateInputData &aggr_input) {
		auto &input_str = UnifiedVectorFormat::GetData<T>(bin_data)[bin_data.sel->get_index(offset)];
		if (input_str.IsInlined()) {
			// inlined strings can be inserted directly
			return input_str;
		}
		// if the string is not inlined we need to allocate space for it
		auto input_str_size = UnsafeNumericCast<uint32_t>(input_str.GetSize());
		auto string_memory = aggr_input.allocator.Allocate(input_str_size);
		// copy over the string
		memcpy(string_memory, input_str.GetData(), input_str_size);
		// now insert it into the histogram
		string_t histogram_str(char_ptr_cast(string_memory), input_str_size);
		return histogram_str;
	}